

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecaySpectrum.test.cpp
# Opt level: O1

void verifyChunkWithLCONTwo(DecaySpectrum *chunk)

{
  pointer pDVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  double dVar5;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef macroName_08;
  StringRef macroName_09;
  StringRef macroName_10;
  StringRef macroName_11;
  StringRef macroName_12;
  StringRef macroName_13;
  StringRef macroName_14;
  StringRef macroName_15;
  StringRef macroName_16;
  StringRef macroName_17;
  StringRef macroName_18;
  StringRef macroName_19;
  StringRef macroName_20;
  StringRef macroName_21;
  StringRef macroName_22;
  StringRef macroName_23;
  StringRef macroName_24;
  StringRef macroName_25;
  StringRef macroName_26;
  StringRef macroName_27;
  StringRef macroName_28;
  StringRef macroName_29;
  StringRef macroName_30;
  StringRef macroName_31;
  StringRef macroName_32;
  StringRef macroName_33;
  StringRef macroName_34;
  StringRef macroName_35;
  StringRef macroName_36;
  StringRef macroName_37;
  StringRef macroName_38;
  StringRef macroName_39;
  StringRef macroName_40;
  StringRef macroName_41;
  StringRef macroName_42;
  StringRef macroName_43;
  StringRef macroName_44;
  StringRef macroName_45;
  StringRef macroName_46;
  StringRef macroName_47;
  StringRef macroName_48;
  StringRef macroName_49;
  StringRef macroName_50;
  StringRef macroName_51;
  StringRef macroName_52;
  StringRef macroName_53;
  StringRef macroName_54;
  StringRef macroName_55;
  StringRef macroName_56;
  StringRef macroName_57;
  StringRef macroName_58;
  StringRef macroName_59;
  StringRef macroName_60;
  StringRef macroName_61;
  StringRef macroName_62;
  StringRef macroName_63;
  StringRef macroName_64;
  StringRef macroName_65;
  StringRef macroName_66;
  StringRef macroName_67;
  StringRef macroName_68;
  StringRef macroName_69;
  StringRef macroName_70;
  StringRef macroName_71;
  StringRef macroName_72;
  StringRef macroName_73;
  StringRef macroName_74;
  StringRef macroName_75;
  StringRef macroName_76;
  StringRef macroName_77;
  StringRef macroName_78;
  StringRef macroName_79;
  StringRef macroName_80;
  StringRef macroName_81;
  StringRef macroName_82;
  StringRef macroName_83;
  StringRef macroName_84;
  StringRef macroName_85;
  StringRef macroName_86;
  StringRef macroName_87;
  StringRef macroName_88;
  StringRef macroName_89;
  StringRef macroName_90;
  StringRef macroName_91;
  StringRef macroName_92;
  StringRef macroName_93;
  StringRef macroName_94;
  StringRef macroName_95;
  StringRef macroName_96;
  StringRef macroName_97;
  StringRef macroName_98;
  StringRef macroName_99;
  StringRef macroName_x00100;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  StringRef capturedExpression_10;
  StringRef capturedExpression_11;
  StringRef capturedExpression_12;
  StringRef capturedExpression_13;
  StringRef capturedExpression_14;
  StringRef capturedExpression_15;
  StringRef capturedExpression_16;
  StringRef capturedExpression_17;
  StringRef capturedExpression_18;
  StringRef capturedExpression_19;
  StringRef capturedExpression_20;
  StringRef capturedExpression_21;
  StringRef capturedExpression_22;
  StringRef capturedExpression_23;
  StringRef capturedExpression_24;
  StringRef capturedExpression_25;
  StringRef capturedExpression_26;
  StringRef capturedExpression_27;
  StringRef capturedExpression_28;
  StringRef capturedExpression_29;
  StringRef capturedExpression_30;
  StringRef capturedExpression_31;
  StringRef capturedExpression_32;
  StringRef capturedExpression_33;
  StringRef capturedExpression_34;
  StringRef capturedExpression_35;
  StringRef capturedExpression_36;
  StringRef capturedExpression_37;
  StringRef capturedExpression_38;
  StringRef capturedExpression_39;
  StringRef capturedExpression_40;
  StringRef capturedExpression_41;
  StringRef capturedExpression_42;
  StringRef capturedExpression_43;
  StringRef capturedExpression_44;
  StringRef capturedExpression_45;
  StringRef capturedExpression_46;
  StringRef capturedExpression_47;
  StringRef capturedExpression_48;
  StringRef capturedExpression_49;
  StringRef capturedExpression_50;
  StringRef capturedExpression_51;
  StringRef capturedExpression_52;
  StringRef capturedExpression_53;
  StringRef capturedExpression_54;
  StringRef capturedExpression_55;
  StringRef capturedExpression_56;
  StringRef capturedExpression_57;
  StringRef capturedExpression_58;
  StringRef capturedExpression_59;
  StringRef capturedExpression_60;
  StringRef capturedExpression_61;
  StringRef capturedExpression_62;
  StringRef capturedExpression_63;
  StringRef capturedExpression_64;
  StringRef capturedExpression_65;
  StringRef capturedExpression_66;
  StringRef capturedExpression_67;
  StringRef capturedExpression_68;
  StringRef capturedExpression_69;
  StringRef capturedExpression_70;
  StringRef capturedExpression_71;
  StringRef capturedExpression_72;
  StringRef capturedExpression_73;
  StringRef capturedExpression_74;
  StringRef capturedExpression_75;
  StringRef capturedExpression_76;
  StringRef capturedExpression_77;
  StringRef capturedExpression_78;
  StringRef capturedExpression_79;
  StringRef capturedExpression_80;
  StringRef capturedExpression_81;
  StringRef capturedExpression_82;
  StringRef capturedExpression_83;
  StringRef capturedExpression_84;
  StringRef capturedExpression_85;
  StringRef capturedExpression_86;
  StringRef capturedExpression_87;
  StringRef capturedExpression_88;
  StringRef capturedExpression_89;
  StringRef capturedExpression_90;
  StringRef capturedExpression_91;
  StringRef capturedExpression_92;
  StringRef capturedExpression_93;
  StringRef capturedExpression_94;
  StringRef capturedExpression_95;
  StringRef capturedExpression_96;
  StringRef capturedExpression_97;
  StringRef capturedExpression_98;
  StringRef capturedExpression_99;
  StringRef capturedExpression_x00100;
  AssertionHandler catchAssertionHandler_79;
  ContinuousSpectrum continuous;
  undefined1 local_178 [8];
  undefined8 local_170;
  char *local_168;
  char *local_160;
  int local_158;
  undefined4 uStack_154;
  OptionalContinuousSpectrum *local_150;
  bool local_13d;
  IResultCapture *local_138;
  undefined1 local_130 [8];
  undefined8 local_128;
  ITransientExpression *local_120;
  char *local_118 [2];
  double local_108;
  ITransientExpression local_f8;
  double *local_e8;
  WithinRelMatcher *local_e0;
  undefined1 local_d8 [48];
  undefined1 local_a8 [16];
  IResultCapture *local_98;
  vector<long,_std::allocator<long>_> local_90;
  vector<double,_std::allocator<double>_> local_78;
  vector<double,_std::allocator<double>_> local_60;
  double local_40;
  OptionalContinuousSpectrum *local_38;
  
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1b0;
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  capturedExpression.m_size = 0x12;
  capturedExpression.m_start = "0. == chunk.STYP()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName,(SourceLineInfo *)local_178,capturedExpression,
             ContinueOnFailure);
  local_150 = (OptionalContinuousSpectrum *)
              (chunk->data_).metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Head_base<1UL,_double,_false>._M_head_impl;
  local_170._1_1_ = (double)local_150 == 0.0;
  local_170._0_1_ = true;
  local_178 = (undefined1  [8])&PTR_streamReconstructedExpression_001e8178;
  local_168 = (char *)0x0;
  local_160 = "==";
  _local_158 = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_178);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1b1;
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  capturedExpression_00.m_size = 0x1b;
  capturedExpression_00.m_start = "0. == chunk.radiationType()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_00,(SourceLineInfo *)local_178,
             capturedExpression_00,ContinueOnFailure);
  local_150 = (OptionalContinuousSpectrum *)
              (chunk->data_).metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Head_base<1UL,_double,_false>._M_head_impl;
  local_170._1_1_ = (double)local_150 == 0.0;
  local_170._0_1_ = true;
  local_178 = (undefined1  [8])&PTR_streamReconstructedExpression_001e8178;
  local_168 = (char *)0x0;
  local_160 = "==";
  _local_158 = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_178);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1b3;
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  capturedExpression_01.m_size = 0x11;
  capturedExpression_01.m_start = "2 == chunk.LCON()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_01,(SourceLineInfo *)local_178,
             capturedExpression_01,ContinueOnFailure);
  iVar4 = (int)(chunk->data_).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
               _M_head_impl;
  local_170._1_1_ = iVar4 == 2;
  local_170._0_1_ = true;
  local_178 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81b8;
  local_170._4_4_ = 2;
  local_168 = "==";
  local_160 = (char *)0x2;
  local_158 = iVar4;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_178);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1b4;
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  capturedExpression_02.m_size = 0x1d;
  capturedExpression_02.m_start = "2 == chunk.spectralTypeFlag()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_02,(SourceLineInfo *)local_178,
             capturedExpression_02,ContinueOnFailure);
  iVar4 = (int)(chunk->data_).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
               _M_head_impl;
  local_170._1_1_ = iVar4 == 2;
  local_170._0_1_ = true;
  local_178 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81b8;
  local_170._4_4_ = 2;
  local_168 = "==";
  local_160 = (char *)0x2;
  local_158 = iVar4;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_178);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1b5;
  macroName_03.m_size = 5;
  macroName_03.m_start = "CHECK";
  capturedExpression_03.m_size = 0x11;
  capturedExpression_03.m_start = "0 == chunk.LCOV()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_03,(SourceLineInfo *)local_178,
             capturedExpression_03,ContinueOnFailure);
  iVar4 = (int)(chunk->data_).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
               _M_head_impl;
  local_170._1_1_ = iVar4 == 0;
  local_170._0_1_ = true;
  local_178 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81b8;
  local_170 = local_170 & 0xffffffff;
  local_168 = "==";
  local_160 = (char *)0x2;
  local_158 = iVar4;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_178);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1b6;
  macroName_04.m_size = 5;
  macroName_04.m_start = "CHECK";
  capturedExpression_04.m_size = 0x1b;
  capturedExpression_04.m_start = "0 == chunk.covarianceFlag()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_04,(SourceLineInfo *)local_178,
             capturedExpression_04,ContinueOnFailure);
  iVar4 = (int)(chunk->data_).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
               _M_head_impl;
  local_170._1_1_ = iVar4 == 0;
  local_170._0_1_ = true;
  local_178 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81b8;
  local_170 = local_170 & 0xffffffff;
  local_168 = "==";
  local_160 = (char *)0x2;
  local_158 = iVar4;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_178);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1b7;
  macroName_05.m_size = 5;
  macroName_05.m_start = "CHECK";
  capturedExpression_05.m_size = 0x10;
  capturedExpression_05.m_start = "2 == chunk.NER()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_05,(SourceLineInfo *)local_178,
             capturedExpression_05,ContinueOnFailure);
  iVar4 = *(int *)&(chunk->data_).metadata.fields.
                   super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<2UL,_long,_long,_long,_long>.
                   super__Tuple_impl<3UL,_long,_long,_long>;
  local_170._1_1_ = iVar4 == 2;
  local_170._0_1_ = true;
  local_178 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81b8;
  local_170._4_4_ = 2;
  local_168 = "==";
  local_160 = (char *)0x2;
  local_158 = iVar4;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_178);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1b8;
  macroName_06.m_size = 5;
  macroName_06.m_start = "CHECK";
  capturedExpression_06.m_size = 0x22;
  capturedExpression_06.m_start = "2 == chunk.numberDiscreteSpectra()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_06,(SourceLineInfo *)local_178,
             capturedExpression_06,ContinueOnFailure);
  iVar4 = *(int *)&(chunk->data_).metadata.fields.
                   super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<2UL,_long,_long,_long,_long>.
                   super__Tuple_impl<3UL,_long,_long,_long>;
  local_170._1_1_ = iVar4 == 2;
  local_170._0_1_ = true;
  local_178 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81b8;
  local_170._4_4_ = 2;
  local_168 = "==";
  local_160 = (char *)0x2;
  local_158 = iVar4;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_178);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1ba;
  macroName_07.m_size = 10;
  macroName_07.m_start = "CHECK_THAT";
  capturedExpression_07.m_size = 0x1e;
  capturedExpression_07.m_start = "1., WithinRel( chunk.FD()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_07,(SourceLineInfo *)local_178,
             capturedExpression_07,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x3ff0000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_178,
             *(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1bb;
  macroName_08.m_size = 10;
  macroName_08.m_start = "CHECK_THAT";
  capturedExpression_08.m_size = 0x1e;
  capturedExpression_08.m_start = "0., WithinRel( chunk.FD()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_08,(SourceLineInfo *)local_178,
             capturedExpression_08,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_178,
             (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[1]);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1bc;
  macroName_09.m_size = 10;
  macroName_09.m_start = "CHECK_THAT";
  capturedExpression_09.m_size = 0x37;
  capturedExpression_09.m_start = "1., WithinRel( chunk.discreteNormalisationFactor()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_09,(SourceLineInfo *)local_178,
             capturedExpression_09,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x3ff0000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_178,
             *(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1bd;
  macroName_10.m_size = 10;
  macroName_10.m_start = "CHECK_THAT";
  capturedExpression_10.m_size = 0x37;
  capturedExpression_10.m_start = "0., WithinRel( chunk.discreteNormalisationFactor()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_10,(SourceLineInfo *)local_178,
             capturedExpression_10,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_178,
             (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[1]);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1be;
  macroName_11.m_size = 10;
  macroName_11.m_start = "CHECK_THAT";
  capturedExpression_11.m_size = 0x1f;
  capturedExpression_11.m_start = "0.5, WithinRel( chunk.FC()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_11,(SourceLineInfo *)local_178,
             capturedExpression_11,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x3fe0000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_178,
             (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[4]);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1bf;
  macroName_12.m_size = 10;
  macroName_12.m_start = "CHECK_THAT";
  capturedExpression_12.m_size = 0x20;
  capturedExpression_12.m_start = "0.25, WithinRel( chunk.FC()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_12,(SourceLineInfo *)local_178,
             capturedExpression_12,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x3fd0000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_178,
             (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[5]);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1c0;
  macroName_13.m_size = 10;
  macroName_13.m_start = "CHECK_THAT";
  capturedExpression_13.m_size = 0x3a;
  capturedExpression_13.m_start = "0.5, WithinRel( chunk.continuousNormalisationFactor()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_13,(SourceLineInfo *)local_178,
             capturedExpression_13,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x3fe0000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_178,
             (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[4]);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1c1;
  macroName_14.m_size = 10;
  macroName_14.m_start = "CHECK_THAT";
  capturedExpression_14.m_size = 0x3b;
  capturedExpression_14.m_start = "0.25, WithinRel( chunk.continuousNormalisationFactor()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_14,(SourceLineInfo *)local_178,
             capturedExpression_14,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x3fd0000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_178,
             (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[5]);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1c2;
  macroName_15.m_size = 10;
  macroName_15.m_start = "CHECK_THAT";
  capturedExpression_15.m_size = 0x29;
  capturedExpression_15.m_start = "2.107044e+2, WithinRel( chunk.ERAV()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_15,(SourceLineInfo *)local_178,
             capturedExpression_15,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x406a568a71de69ad;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_178,
             (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[2]);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1c3;
  macroName_16.m_size = 10;
  macroName_16.m_start = "CHECK_THAT";
  capturedExpression_16.m_size = 0x29;
  capturedExpression_16.m_start = "1.576284e+1, WithinRel( chunk.ERAV()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_16,(SourceLineInfo *)local_178,
             capturedExpression_16,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x402f8692f6e8294a;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_178,
             (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[3]);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1c4;
  macroName_17.m_size = 10;
  macroName_17.m_start = "CHECK_THAT";
  capturedExpression_17.m_size = 0x37;
  capturedExpression_17.m_start = "2.107044e+2, WithinRel( chunk.averageDecayEnergy()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_17,(SourceLineInfo *)local_178,
             capturedExpression_17,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x406a568a71de69ad;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_178,
             (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[2]);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1c5;
  macroName_18.m_size = 10;
  macroName_18.m_start = "CHECK_THAT";
  capturedExpression_18.m_size = 0x37;
  capturedExpression_18.m_start = "1.576284e+1, WithinRel( chunk.averageDecayEnergy()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_18,(SourceLineInfo *)local_178,
             capturedExpression_18,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x402f8692f6e8294a;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_178,
             (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[3]);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1c7;
  macroName_19.m_size = 5;
  macroName_19.m_start = "CHECK";
  capturedExpression_19.m_size = 0x2a;
  capturedExpression_19.m_start = "std::nullopt != chunk.continuousSpectrum()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_19,(SourceLineInfo *)local_178,
             capturedExpression_19,ContinueOnFailure);
  local_150 = &chunk->continuous_;
  local_170._1_1_ =
       (chunk->continuous_).
       super__Optional_base<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum,_false,_false>.
       _M_payload.
       super__Optional_payload<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum,_true,_false,_false>
       .super__Optional_payload_base<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum>.
       _M_engaged;
  local_170._0_1_ = true;
  local_178 = (undefined1  [8])&PTR_streamReconstructedExpression_001e8238;
  local_168 = "";
  local_160 = "!=";
  _local_158 = 2;
  local_38 = local_150;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_178);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1ca;
  macroName_20.m_size = 5;
  macroName_20.m_start = "CHECK";
  capturedExpression_20.m_size = 0x18;
  capturedExpression_20.m_start = "3. == discrete[0].RTYP()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_20,(SourceLineInfo *)local_178,
             capturedExpression_20,ContinueOnFailure);
  local_150 = (OptionalContinuousSpectrum *)
              *(((chunk->discrete_).
                 super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                 ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).data.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
  local_170._1_1_ = (double)local_150 == 3.0;
  local_170._0_1_ = true;
  local_178 = (undefined1  [8])&PTR_streamReconstructedExpression_001e8178;
  local_168 = (char *)0x4008000000000000;
  local_160 = "==";
  _local_158 = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_178);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1cb;
  macroName_21.m_size = 5;
  macroName_21.m_start = "CHECK";
  capturedExpression_21.m_size = 0x1e;
  capturedExpression_21.m_start = "3. == discrete[0].decayChain()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_21,(SourceLineInfo *)local_178,
             capturedExpression_21,ContinueOnFailure);
  local_150 = (OptionalContinuousSpectrum *)
              *(((chunk->discrete_).
                 super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                 ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).data.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
  local_170._1_1_ = (double)local_150 == 3.0;
  local_170._0_1_ = true;
  local_178 = (undefined1  [8])&PTR_streamReconstructedExpression_001e8178;
  local_168 = (char *)0x4008000000000000;
  local_160 = "==";
  _local_158 = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_178);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1cc;
  macroName_22.m_size = 5;
  macroName_22.m_start = "CHECK";
  capturedExpression_22.m_size = 0x16;
  capturedExpression_22.m_start = "12 == discrete[0].NT()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_22,(SourceLineInfo *)local_178,
             capturedExpression_22,ContinueOnFailure);
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar4 = (int)((ulong)((long)(pDVar1->super_ListRecord).data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       *(long *)&(pDVar1->super_ListRecord).data.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data) >> 3);
  local_170._1_1_ = iVar4 == 0xc;
  local_170._0_1_ = true;
  local_178 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81b8;
  local_170._4_4_ = 0xc;
  local_168 = "==";
  local_160 = (char *)0x2;
  local_158 = iVar4;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_178);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1cd;
  macroName_23.m_size = 10;
  macroName_23.m_start = "CHECK_THAT";
  capturedExpression_23.m_size = 0x2d;
  capturedExpression_23.m_start = "4.863000e+4, WithinRel( discrete[0].ER()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_23,(SourceLineInfo *)local_178,
             capturedExpression_23,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x40e7bec000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_178,
             (((chunk->discrete_).
               super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
               ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Head_base<0UL,_double,_false>._M_head_impl);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1ce;
  macroName_24.m_size = 10;
  macroName_24.m_start = "CHECK_THAT";
  capturedExpression_24.m_size = 0x2d;
  capturedExpression_24.m_start = "5.000000e+1, WithinRel( discrete[0].ER()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_24,(SourceLineInfo *)local_178,
             capturedExpression_24,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x4049000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_178,
             (((chunk->discrete_).
               super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
               ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Head_base<1UL,_double,_false>._M_head_impl);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1cf;
  macroName_25.m_size = 10;
  macroName_25.m_start = "CHECK_THAT";
  capturedExpression_25.m_size = 0x39;
  capturedExpression_25.m_start = "4.863000e+4, WithinRel( discrete[0].discreteEnergy()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_25,(SourceLineInfo *)local_178,
             capturedExpression_25,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x40e7bec000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_178,
             (((chunk->discrete_).
               super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
               ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Head_base<0UL,_double,_false>._M_head_impl);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1d0;
  macroName_26.m_size = 10;
  macroName_26.m_start = "CHECK_THAT";
  capturedExpression_26.m_size = 0x39;
  capturedExpression_26.m_start = "5.000000e+1, WithinRel( discrete[0].discreteEnergy()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_26,(SourceLineInfo *)local_178,
             capturedExpression_26,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x4049000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_178,
             (((chunk->discrete_).
               super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
               ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Head_base<1UL,_double,_false>._M_head_impl);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1d1;
  macroName_27.m_size = 10;
  macroName_27.m_start = "CHECK_THAT";
  capturedExpression_27.m_size = 0x2d;
  capturedExpression_27.m_start = "1.420112e-6, WithinRel( discrete[0].RI()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_27,(SourceLineInfo *)local_178,
             capturedExpression_27,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x3eb7d355a82063d2;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&(pDVar1->super_ListRecord).data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (2 < (int)((ulong)((long)(pDVar1->super_ListRecord).data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x10);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1d2;
  macroName_28.m_size = 10;
  macroName_28.m_start = "CHECK_THAT";
  capturedExpression_28.m_size = 0x2d;
  capturedExpression_28.m_start = "2.85306e-10, WithinRel( discrete[0].RI()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_28,(SourceLineInfo *)local_178,
             capturedExpression_28,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x3df39b27fecb19b6;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&(pDVar1->super_ListRecord).data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (2 < (int)((ulong)((long)(pDVar1->super_ListRecord).data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x18);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1d3;
  macroName_29.m_size = 10;
  macroName_29.m_start = "CHECK_THAT";
  capturedExpression_29.m_size = 0x3c;
  capturedExpression_29.m_start = "1.420112e-6, WithinRel( discrete[0].relativeIntensity()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_29,(SourceLineInfo *)local_178,
             capturedExpression_29,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x3eb7d355a82063d2;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&(pDVar1->super_ListRecord).data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (2 < (int)((ulong)((long)(pDVar1->super_ListRecord).data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x10);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1d4;
  macroName_30.m_size = 10;
  macroName_30.m_start = "CHECK_THAT";
  capturedExpression_30.m_size = 0x3c;
  capturedExpression_30.m_start = "2.85306e-10, WithinRel( discrete[0].relativeIntensity()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_30,(SourceLineInfo *)local_178,
             capturedExpression_30,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x3df39b27fecb19b6;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&(pDVar1->super_ListRecord).data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (2 < (int)((ulong)((long)(pDVar1->super_ListRecord).data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x18);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1d5;
  macroName_31.m_size = 5;
  macroName_31.m_start = "CHECK";
  capturedExpression_31.m_size = 0x18;
  capturedExpression_31.m_start = "0. == discrete[0].TYPE()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_31,(SourceLineInfo *)local_178,
             capturedExpression_31,ContinueOnFailure);
  local_150 = *(OptionalContinuousSpectrum **)
               (*(long *)&(((chunk->discrete_).
                            super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                            ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).data.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data + 8);
  local_170._1_1_ = (double)local_150 == 0.0;
  local_170._0_1_ = true;
  local_178 = (undefined1  [8])&PTR_streamReconstructedExpression_001e8178;
  local_168 = (char *)0x0;
  local_160 = "==";
  _local_158 = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_178);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1d6;
  macroName_32.m_size = 5;
  macroName_32.m_start = "CHECK";
  capturedExpression_32.m_size = 0x18;
  capturedExpression_32.m_start = "0. == discrete[0].type()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_32,(SourceLineInfo *)local_178,
             capturedExpression_32,ContinueOnFailure);
  local_150 = *(OptionalContinuousSpectrum **)
               (*(long *)&(((chunk->discrete_).
                            super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                            ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).data.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data + 8);
  local_170._1_1_ = (double)local_150 == 0.0;
  local_170._0_1_ = true;
  local_178 = (undefined1  [8])&PTR_streamReconstructedExpression_001e8178;
  local_168 = (char *)0x0;
  local_160 = "==";
  _local_158 = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_178);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1d7;
  macroName_33.m_size = 10;
  macroName_33.m_start = "CHECK_THAT";
  capturedExpression_33.m_size = 0x26;
  capturedExpression_33.m_start = "0.0, WithinRel( discrete[0].RIS()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_33,(SourceLineInfo *)local_178,
             capturedExpression_33,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x0;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&(pDVar1->super_ListRecord).data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (4 < (int)((ulong)((long)(pDVar1->super_ListRecord).data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x20);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1d8;
  macroName_34.m_size = 10;
  macroName_34.m_start = "CHECK_THAT";
  capturedExpression_34.m_size = 0x26;
  capturedExpression_34.m_start = "0.0, WithinRel( discrete[0].RIS()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_34,(SourceLineInfo *)local_178,
             capturedExpression_34,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x0;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&(pDVar1->super_ListRecord).data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (4 < (int)((ulong)((long)(pDVar1->super_ListRecord).data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x28);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1d9;
  macroName_35.m_size = 10;
  macroName_35.m_start = "CHECK_THAT";
  capturedExpression_35.m_size = 0x43;
  capturedExpression_35.m_start =
       "0.0, WithinRel( discrete[0].internalPairFormationCoefficient()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_35,(SourceLineInfo *)local_178,
             capturedExpression_35,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x0;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&(pDVar1->super_ListRecord).data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (4 < (int)((ulong)((long)(pDVar1->super_ListRecord).data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x20);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1da;
  macroName_36.m_size = 10;
  macroName_36.m_start = "CHECK_THAT";
  capturedExpression_36.m_size = 0x43;
  capturedExpression_36.m_start =
       "0.0, WithinRel( discrete[0].internalPairFormationCoefficient()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_36,(SourceLineInfo *)local_178,
             capturedExpression_36,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x0;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&(pDVar1->super_ListRecord).data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (4 < (int)((ulong)((long)(pDVar1->super_ListRecord).data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x28);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1db;
  macroName_37.m_size = 10;
  macroName_37.m_start = "CHECK_THAT";
  capturedExpression_37.m_size = 0x2f;
  capturedExpression_37.m_start = "7.010000e+5, WithinRel( discrete[0].RICC()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_37,(SourceLineInfo *)local_178,
             capturedExpression_37,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x4125649000000000;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&(pDVar1->super_ListRecord).data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (6 < (int)((ulong)((long)(pDVar1->super_ListRecord).data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x30);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1dc;
  macroName_38.m_size = 10;
  macroName_38.m_start = "CHECK_THAT";
  capturedExpression_38.m_size = 0x2f;
  capturedExpression_38.m_start = "1.106180e-2, WithinRel( discrete[0].RICC()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_38,(SourceLineInfo *)local_178,
             capturedExpression_38,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x3f86a791a9e10f7a;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&(pDVar1->super_ListRecord).data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (6 < (int)((ulong)((long)(pDVar1->super_ListRecord).data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x38);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1dd;
  macroName_39.m_size = 10;
  macroName_39.m_start = "CHECK_THAT";
  capturedExpression_39.m_size = 0x4d;
  capturedExpression_39.m_start =
       "7.010000e+5, WithinRel( discrete[0].totalInternalConversionCoefficient()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_39,(SourceLineInfo *)local_178,
             capturedExpression_39,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x4125649000000000;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&(pDVar1->super_ListRecord).data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (6 < (int)((ulong)((long)(pDVar1->super_ListRecord).data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x30);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1de;
  macroName_40.m_size = 10;
  macroName_40.m_start = "CHECK_THAT";
  capturedExpression_40.m_size = 0x4d;
  capturedExpression_40.m_start =
       "1.106180e-2, WithinRel( discrete[0].totalInternalConversionCoefficient()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_40,(SourceLineInfo *)local_178,
             capturedExpression_40,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x3f86a791a9e10f7a;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&(pDVar1->super_ListRecord).data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (6 < (int)((ulong)((long)(pDVar1->super_ListRecord).data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x38);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1df;
  macroName_41.m_size = 10;
  macroName_41.m_start = "CHECK_THAT";
  capturedExpression_41.m_size = 0x27;
  capturedExpression_41.m_start = "0.0, WithinRel( discrete[0].RICK()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_41,(SourceLineInfo *)local_178,
             capturedExpression_41,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x0;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&(pDVar1->super_ListRecord).data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (8 < (int)((ulong)((long)(pDVar1->super_ListRecord).data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x40);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1e0;
  macroName_42.m_size = 10;
  macroName_42.m_start = "CHECK_THAT";
  capturedExpression_42.m_size = 0x27;
  capturedExpression_42.m_start = "0.0, WithinRel( discrete[0].RICK()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_42,(SourceLineInfo *)local_178,
             capturedExpression_42,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x0;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&(pDVar1->super_ListRecord).data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (8 < (int)((ulong)((long)(pDVar1->super_ListRecord).data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x48);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1e1;
  macroName_43.m_size = 10;
  macroName_43.m_start = "CHECK_THAT";
  capturedExpression_43.m_size = 0x46;
  capturedExpression_43.m_start =
       "0.0, WithinRel( discrete[0].internalConversionCoefficientKShell()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_43,(SourceLineInfo *)local_178,
             capturedExpression_43,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x0;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&(pDVar1->super_ListRecord).data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (8 < (int)((ulong)((long)(pDVar1->super_ListRecord).data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x40);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1e2;
  macroName_44.m_size = 10;
  macroName_44.m_start = "CHECK_THAT";
  capturedExpression_44.m_size = 0x46;
  capturedExpression_44.m_start =
       "0.0, WithinRel( discrete[0].internalConversionCoefficientKShell()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_44,(SourceLineInfo *)local_178,
             capturedExpression_44,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x0;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&(pDVar1->super_ListRecord).data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (8 < (int)((ulong)((long)(pDVar1->super_ListRecord).data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x48);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1e3;
  macroName_45.m_size = 10;
  macroName_45.m_start = "CHECK_THAT";
  capturedExpression_45.m_size = 0x2f;
  capturedExpression_45.m_start = "3.315735e+5, WithinRel( discrete[0].RICL()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_45,(SourceLineInfo *)local_178,
             capturedExpression_45,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x41143cd600000000;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&(pDVar1->super_ListRecord).data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (10 < (int)((ulong)((long)(pDVar1->super_ListRecord).data.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x50);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1e4;
  macroName_46.m_size = 10;
  macroName_46.m_start = "CHECK_THAT";
  capturedExpression_46.m_size = 0x2f;
  capturedExpression_46.m_start = "5.608008e+3, WithinRel( discrete[0].RICL()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_46,(SourceLineInfo *)local_178,
             capturedExpression_46,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x40b5e8020c49ba5e;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&(pDVar1->super_ListRecord).data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (10 < (int)((ulong)((long)(pDVar1->super_ListRecord).data.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x58);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1e5;
  macroName_47.m_size = 10;
  macroName_47.m_start = "CHECK_THAT";
  capturedExpression_47.m_size = 0x4e;
  capturedExpression_47.m_start =
       "3.315735e+5, WithinRel( discrete[0].internalConversionCoefficientLShell()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_47,(SourceLineInfo *)local_178,
             capturedExpression_47,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x41143cd600000000;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&(pDVar1->super_ListRecord).data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (10 < (int)((ulong)((long)(pDVar1->super_ListRecord).data.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x50);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1e6;
  macroName_48.m_size = 10;
  macroName_48.m_start = "CHECK_THAT";
  capturedExpression_48.m_size = 0x4e;
  capturedExpression_48.m_start =
       "5.608008e+3, WithinRel( discrete[0].internalConversionCoefficientLShell()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_48,(SourceLineInfo *)local_178,
             capturedExpression_48,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x40b5e8020c49ba5e;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&(pDVar1->super_ListRecord).data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (10 < (int)((ulong)((long)(pDVar1->super_ListRecord).data.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x58);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1e7;
  macroName_49.m_size = 5;
  macroName_49.m_start = "CHECK";
  capturedExpression_49.m_size = 0x18;
  capturedExpression_49.m_start = "4. == discrete[1].RTYP()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_49,(SourceLineInfo *)local_178,
             capturedExpression_49,ContinueOnFailure);
  local_150 = (OptionalContinuousSpectrum *)
              *(chunk->discrete_).
               super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
               ._M_impl.super__Vector_impl_data._M_start[1].super_ListRecord.data.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
  local_170._1_1_ = (double)local_150 == 4.0;
  local_170._0_1_ = true;
  local_178 = (undefined1  [8])&PTR_streamReconstructedExpression_001e8178;
  local_168 = (char *)0x4010000000000000;
  local_160 = "==";
  _local_158 = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_178);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1e8;
  macroName_50.m_size = 5;
  macroName_50.m_start = "CHECK";
  capturedExpression_50.m_size = 0x1e;
  capturedExpression_50.m_start = "4. == discrete[1].decayChain()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_50,(SourceLineInfo *)local_178,
             capturedExpression_50,ContinueOnFailure);
  local_150 = (OptionalContinuousSpectrum *)
              *(chunk->discrete_).
               super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
               ._M_impl.super__Vector_impl_data._M_start[1].super_ListRecord.data.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
  local_170._1_1_ = (double)local_150 == 4.0;
  local_170._0_1_ = true;
  local_178 = (undefined1  [8])&PTR_streamReconstructedExpression_001e8178;
  local_168 = (char *)0x4010000000000000;
  local_160 = "==";
  _local_158 = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_178);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1e9;
  macroName_51.m_size = 5;
  macroName_51.m_start = "CHECK";
  capturedExpression_51.m_size = 0x16;
  capturedExpression_51.m_start = "12 == discrete[1].NT()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_51,(SourceLineInfo *)local_178,
             capturedExpression_51,ContinueOnFailure);
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar4 = (int)((ulong)((long)pDVar1[1].super_ListRecord.data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       *(long *)&pDVar1[1].super_ListRecord.data.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data) >> 3);
  local_170._1_1_ = iVar4 == 0xc;
  local_170._0_1_ = true;
  local_178 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81b8;
  local_170._4_4_ = 0xc;
  local_168 = "==";
  local_160 = (char *)0x2;
  local_158 = iVar4;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_178);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1ea;
  macroName_52.m_size = 10;
  macroName_52.m_start = "CHECK_THAT";
  capturedExpression_52.m_size = 0x2d;
  capturedExpression_52.m_start = "4.935000e+4, WithinRel( discrete[1].ER()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_52,(SourceLineInfo *)local_178,
             capturedExpression_52,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x40e818c000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_178,
             (chunk->discrete_).
             super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
             ._M_impl.super__Vector_impl_data._M_start[1].super_ListRecord.metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Head_base<0UL,_double,_false>._M_head_impl);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1eb;
  macroName_53.m_size = 10;
  macroName_53.m_start = "CHECK_THAT";
  capturedExpression_53.m_size = 0x2d;
  capturedExpression_53.m_start = "2.000000e+1, WithinRel( discrete[1].ER()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_53,(SourceLineInfo *)local_178,
             capturedExpression_53,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x4034000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_178,
             (chunk->discrete_).
             super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
             ._M_impl.super__Vector_impl_data._M_start[1].super_ListRecord.metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Head_base<1UL,_double,_false>._M_head_impl);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1ec;
  macroName_54.m_size = 10;
  macroName_54.m_start = "CHECK_THAT";
  capturedExpression_54.m_size = 0x39;
  capturedExpression_54.m_start = "4.935000e+4, WithinRel( discrete[1].discreteEnergy()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_54,(SourceLineInfo *)local_178,
             capturedExpression_54,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x40e818c000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_178,
             (chunk->discrete_).
             super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
             ._M_impl.super__Vector_impl_data._M_start[1].super_ListRecord.metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Head_base<0UL,_double,_false>._M_head_impl);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1ed;
  macroName_55.m_size = 10;
  macroName_55.m_start = "CHECK_THAT";
  capturedExpression_55.m_size = 0x39;
  capturedExpression_55.m_start = "2.000000e+1, WithinRel( discrete[1].discreteEnergy()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_55,(SourceLineInfo *)local_178,
             capturedExpression_55,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x4034000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_178,
             (chunk->discrete_).
             super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
             ._M_impl.super__Vector_impl_data._M_start[1].super_ListRecord.metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Head_base<1UL,_double,_false>._M_head_impl);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1ee;
  macroName_56.m_size = 10;
  macroName_56.m_start = "CHECK_THAT";
  capturedExpression_56.m_size = 0x2d;
  capturedExpression_56.m_start = "1.335690e-3, WithinRel( discrete[1].RI()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_56,(SourceLineInfo *)local_178,
             capturedExpression_56,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x3f55e24a3786a9fe;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&pDVar1[1].super_ListRecord.data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (2 < (int)((ulong)((long)pDVar1[1].super_ListRecord.data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x10);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1ef;
  macroName_57.m_size = 10;
  macroName_57.m_start = "CHECK_THAT";
  capturedExpression_57.m_size = 0x2d;
  capturedExpression_57.m_start = "5.409179e-5, WithinRel( discrete[1].RI()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_57,(SourceLineInfo *)local_178,
             capturedExpression_57,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x3f0c5c13c093e6cd;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&pDVar1[1].super_ListRecord.data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (2 < (int)((ulong)((long)pDVar1[1].super_ListRecord.data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x18);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1f0;
  macroName_58.m_size = 10;
  macroName_58.m_start = "CHECK_THAT";
  capturedExpression_58.m_size = 0x3c;
  capturedExpression_58.m_start = "1.335690e-3, WithinRel( discrete[1].relativeIntensity()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_58,(SourceLineInfo *)local_178,
             capturedExpression_58,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x3f55e24a3786a9fe;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&pDVar1[1].super_ListRecord.data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (2 < (int)((ulong)((long)pDVar1[1].super_ListRecord.data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x10);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1f1;
  macroName_59.m_size = 10;
  macroName_59.m_start = "CHECK_THAT";
  capturedExpression_59.m_size = 0x3c;
  capturedExpression_59.m_start = "5.409179e-5, WithinRel( discrete[1].relativeIntensity()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_59,(SourceLineInfo *)local_178,
             capturedExpression_59,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x3f0c5c13c093e6cd;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&pDVar1[1].super_ListRecord.data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (2 < (int)((ulong)((long)pDVar1[1].super_ListRecord.data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x18);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1f2;
  macroName_60.m_size = 5;
  macroName_60.m_start = "CHECK";
  capturedExpression_60.m_size = 0x18;
  capturedExpression_60.m_start = "0. == discrete[1].TYPE()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_60,(SourceLineInfo *)local_178,
             capturedExpression_60,ContinueOnFailure);
  local_150 = *(OptionalContinuousSpectrum **)
               (*(long *)&(chunk->discrete_).
                          super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].super_ListRecord.data.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data + 8);
  local_170._1_1_ = (double)local_150 == 0.0;
  local_170._0_1_ = true;
  local_178 = (undefined1  [8])&PTR_streamReconstructedExpression_001e8178;
  local_168 = (char *)0x0;
  local_160 = "==";
  _local_158 = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_178);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1f3;
  macroName_61.m_size = 5;
  macroName_61.m_start = "CHECK";
  capturedExpression_61.m_size = 0x18;
  capturedExpression_61.m_start = "0. == discrete[1].type()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_61,(SourceLineInfo *)local_178,
             capturedExpression_61,ContinueOnFailure);
  local_150 = *(OptionalContinuousSpectrum **)
               (*(long *)&(chunk->discrete_).
                          super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].super_ListRecord.data.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data + 8);
  local_170._1_1_ = (double)local_150 == 0.0;
  local_170._0_1_ = true;
  local_178 = (undefined1  [8])&PTR_streamReconstructedExpression_001e8178;
  local_168 = (char *)0x0;
  local_160 = "==";
  _local_158 = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_178);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1f4;
  macroName_62.m_size = 10;
  macroName_62.m_start = "CHECK_THAT";
  capturedExpression_62.m_size = 0x26;
  capturedExpression_62.m_start = "0.0, WithinRel( discrete[1].RIS()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_62,(SourceLineInfo *)local_178,
             capturedExpression_62,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x0;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&pDVar1[1].super_ListRecord.data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (4 < (int)((ulong)((long)pDVar1[1].super_ListRecord.data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x20);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1f5;
  macroName_63.m_size = 10;
  macroName_63.m_start = "CHECK_THAT";
  capturedExpression_63.m_size = 0x26;
  capturedExpression_63.m_start = "0.0, WithinRel( discrete[1].RIS()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_63,(SourceLineInfo *)local_178,
             capturedExpression_63,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x0;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&pDVar1[1].super_ListRecord.data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (4 < (int)((ulong)((long)pDVar1[1].super_ListRecord.data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x28);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1f6;
  macroName_64.m_size = 10;
  macroName_64.m_start = "CHECK_THAT";
  capturedExpression_64.m_size = 0x43;
  capturedExpression_64.m_start =
       "0.0, WithinRel( discrete[1].internalPairFormationCoefficient()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_64,(SourceLineInfo *)local_178,
             capturedExpression_64,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x0;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&pDVar1[1].super_ListRecord.data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (4 < (int)((ulong)((long)pDVar1[1].super_ListRecord.data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x20);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1f7;
  macroName_65.m_size = 10;
  macroName_65.m_start = "CHECK_THAT";
  capturedExpression_65.m_size = 0x43;
  capturedExpression_65.m_start =
       "0.0, WithinRel( discrete[1].internalPairFormationCoefficient()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_65,(SourceLineInfo *)local_178,
             capturedExpression_65,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x0;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&pDVar1[1].super_ListRecord.data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (4 < (int)((ulong)((long)pDVar1[1].super_ListRecord.data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x28);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1f8;
  macroName_66.m_size = 10;
  macroName_66.m_start = "CHECK_THAT";
  capturedExpression_66.m_size = 0x2f;
  capturedExpression_66.m_start = "8.209999e-1, WithinRel( discrete[1].RICC()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_66,(SourceLineInfo *)local_178,
             capturedExpression_66,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x3fea45a195109ddd;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&pDVar1[1].super_ListRecord.data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (6 < (int)((ulong)((long)pDVar1[1].super_ListRecord.data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x30);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1f9;
  macroName_67.m_size = 10;
  macroName_67.m_start = "CHECK_THAT";
  capturedExpression_67.m_size = 0x2f;
  capturedExpression_67.m_start = "0.000000e+0, WithinRel( discrete[1].RICC()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_67,(SourceLineInfo *)local_178,
             capturedExpression_67,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x0;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&pDVar1[1].super_ListRecord.data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (6 < (int)((ulong)((long)pDVar1[1].super_ListRecord.data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x38);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1fa;
  macroName_68.m_size = 10;
  macroName_68.m_start = "CHECK_THAT";
  capturedExpression_68.m_size = 0x4d;
  capturedExpression_68.m_start =
       "8.209999e-1, WithinRel( discrete[1].totalInternalConversionCoefficient()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_68,(SourceLineInfo *)local_178,
             capturedExpression_68,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x3fea45a195109ddd;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&pDVar1[1].super_ListRecord.data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (6 < (int)((ulong)((long)pDVar1[1].super_ListRecord.data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x30);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1fb;
  macroName_69.m_size = 10;
  macroName_69.m_start = "CHECK_THAT";
  capturedExpression_69.m_size = 0x4d;
  capturedExpression_69.m_start =
       "0.000000e+0, WithinRel( discrete[1].totalInternalConversionCoefficient()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_69,(SourceLineInfo *)local_178,
             capturedExpression_69,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x0;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&pDVar1[1].super_ListRecord.data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (6 < (int)((ulong)((long)pDVar1[1].super_ListRecord.data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x38);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1fc;
  macroName_70.m_size = 10;
  macroName_70.m_start = "CHECK_THAT";
  capturedExpression_70.m_size = 0x27;
  capturedExpression_70.m_start = "0.0, WithinRel( discrete[1].RICK()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_70,(SourceLineInfo *)local_178,
             capturedExpression_70,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x0;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&pDVar1[1].super_ListRecord.data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (8 < (int)((ulong)((long)pDVar1[1].super_ListRecord.data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x40);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1fd;
  macroName_71.m_size = 10;
  macroName_71.m_start = "CHECK_THAT";
  capturedExpression_71.m_size = 0x27;
  capturedExpression_71.m_start = "0.0, WithinRel( discrete[1].RICK()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_71,(SourceLineInfo *)local_178,
             capturedExpression_71,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x0;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&pDVar1[1].super_ListRecord.data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (8 < (int)((ulong)((long)pDVar1[1].super_ListRecord.data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x48);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1fe;
  macroName_72.m_size = 10;
  macroName_72.m_start = "CHECK_THAT";
  capturedExpression_72.m_size = 0x46;
  capturedExpression_72.m_start =
       "0.0, WithinRel( discrete[1].internalConversionCoefficientKShell()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_72,(SourceLineInfo *)local_178,
             capturedExpression_72,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x0;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&pDVar1[1].super_ListRecord.data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (8 < (int)((ulong)((long)pDVar1[1].super_ListRecord.data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x40);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x1ff;
  macroName_73.m_size = 10;
  macroName_73.m_start = "CHECK_THAT";
  capturedExpression_73.m_size = 0x46;
  capturedExpression_73.m_start =
       "0.0, WithinRel( discrete[1].internalConversionCoefficientKShell()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_73,(SourceLineInfo *)local_178,
             capturedExpression_73,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x0;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&pDVar1[1].super_ListRecord.data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (8 < (int)((ulong)((long)pDVar1[1].super_ListRecord.data.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x48);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x200;
  macroName_74.m_size = 10;
  macroName_74.m_start = "CHECK_THAT";
  capturedExpression_74.m_size = 0x2f;
  capturedExpression_74.m_start = "6.160000e-1, WithinRel( discrete[1].RICL()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_74,(SourceLineInfo *)local_178,
             capturedExpression_74,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x3fe3b645a1cac083;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&pDVar1[1].super_ListRecord.data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (10 < (int)((ulong)((long)pDVar1[1].super_ListRecord.data.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x50);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x201;
  macroName_75.m_size = 10;
  macroName_75.m_start = "CHECK_THAT";
  capturedExpression_75.m_size = 0x2f;
  capturedExpression_75.m_start = "8.999999e-3, WithinRel( discrete[1].RICL()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_75,(SourceLineInfo *)local_178,
             capturedExpression_75,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x3f826e976af3c76b;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&pDVar1[1].super_ListRecord.data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (10 < (int)((ulong)((long)pDVar1[1].super_ListRecord.data.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x58);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x202;
  macroName_76.m_size = 10;
  macroName_76.m_start = "CHECK_THAT";
  capturedExpression_76.m_size = 0x4e;
  capturedExpression_76.m_start =
       "6.160000e-1, WithinRel( discrete[1].internalConversionCoefficientLShell()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_76,(SourceLineInfo *)local_178,
             capturedExpression_76,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x3fe3b645a1cac083;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&pDVar1[1].super_ListRecord.data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (10 < (int)((ulong)((long)pDVar1[1].super_ListRecord.data.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x50);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_178 = (undefined1  [8])0x1a6514;
  local_170 = (pointer)0x203;
  macroName_77.m_size = 10;
  macroName_77.m_start = "CHECK_THAT";
  capturedExpression_77.m_size = 0x4e;
  capturedExpression_77.m_start =
       "8.999999e-3, WithinRel( discrete[1].internalConversionCoefficientLShell()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_d8,macroName_77,(SourceLineInfo *)local_178,
             capturedExpression_77,ContinueOnFailure);
  local_f8._vptr_ITransientExpression = (_func_int **)0x3f826e976af3c76b;
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = *(long *)&pDVar1[1].super_ListRecord.data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  dVar5 = 0.0;
  if (10 < (int)((ulong)((long)pDVar1[1].super_ListRecord.data.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish - lVar3) >> 3)) {
    dVar5 = *(double *)(lVar3 + 0x58);
  }
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_178,dVar5);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_178,(double *)&local_f8);
  local_128._1_1_ = bVar2;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e81f8;
  local_120 = &local_f8;
  local_118[0] = (char *)local_178;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_d8,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_178);
  Catch::AssertionHandler::complete((AssertionHandler *)local_d8);
  if (local_a8[0xb] == false) {
    (*local_98->_vptr_IResultCapture[0x13])();
  }
  local_d8._0_8_ =
       *(undefined8 *)
        &(local_38->
         super__Optional_base<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum,_false,_false>
         )._M_payload.
         super__Optional_payload<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum,_true,_false,_false>
         .super__Optional_payload_base<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum>.
         _M_payload._M_value.super_TabulationRecord.super_InterpolationBase;
  local_d8._8_8_ =
       (local_38->
       super__Optional_base<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum,_false,_false>).
       _M_payload.
       super__Optional_payload<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum,_true,_false,_false>
       .super__Optional_payload_base<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum>.
       _M_payload._M_value.super_TabulationRecord.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl;
  local_d8._16_8_ =
       (local_38->
       super__Optional_base<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum,_false,_false>).
       _M_payload.
       super__Optional_payload<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum,_true,_false,_false>
       .super__Optional_payload_base<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum>.
       _M_payload._M_value.super_TabulationRecord.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl;
  local_d8._24_8_ =
       (local_38->
       super__Optional_base<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum,_false,_false>).
       _M_payload.
       super__Optional_payload<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum,_true,_false,_false>
       .super__Optional_payload_base<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum>.
       _M_payload._M_value.super_TabulationRecord.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
       _M_head_impl;
  local_d8._32_8_ =
       (local_38->
       super__Optional_base<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum,_false,_false>).
       _M_payload.
       super__Optional_payload<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum,_true,_false,_false>
       .super__Optional_payload_base<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum>.
       _M_payload._M_value.super_TabulationRecord.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
       _M_head_impl;
  local_d8._40_8_ =
       (local_38->
       super__Optional_base<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum,_false,_false>).
       _M_payload.
       super__Optional_payload<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum,_true,_false,_false>
       .super__Optional_payload_base<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum>.
       _M_payload._M_value.super_TabulationRecord.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)local_a8,
             &(chunk->continuous_).
              super__Optional_base<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum,_false,_false>
              ._M_payload.
              super__Optional_payload<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum,_true,_false,_false>
              .super__Optional_payload_base<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum>
              ._M_payload._M_value.super_TabulationRecord.super_InterpolationBase.boundaryIndices);
  std::vector<long,_std::allocator<long>_>::vector
            (&local_90,
             &(chunk->continuous_).
              super__Optional_base<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum,_false,_false>
              ._M_payload.
              super__Optional_payload<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum,_true,_false,_false>
              .super__Optional_payload_base<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum>
              ._M_payload._M_value.super_TabulationRecord.super_InterpolationBase.
              interpolationSchemeIndices);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_78,
             &(chunk->continuous_).
              super__Optional_base<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum,_false,_false>
              ._M_payload.
              super__Optional_payload<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum,_true,_false,_false>
              .super__Optional_payload_base<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum>
              ._M_payload._M_value.super_TabulationRecord.xValues);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_60,
             &(chunk->continuous_).
              super__Optional_base<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum,_false,_false>
              ._M_payload.
              super__Optional_payload<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum,_true,_false,_false>
              .super__Optional_payload_base<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum>
              ._M_payload._M_value.super_TabulationRecord.yValues);
  local_130 = (undefined1  [8])0x1a6514;
  local_128 = (pointer)0x206;
  macroName_78.m_size = 5;
  macroName_78.m_start = "CHECK";
  capturedExpression_78.m_size = 0x17;
  capturedExpression_78.m_start = "4. == continuous.RTYP()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_78,(SourceLineInfo *)local_130,
             capturedExpression_78,ContinueOnFailure);
  local_128._1_1_ = (double)local_d8._40_8_ == 4.0;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e8178;
  local_120 = (ITransientExpression *)0x4010000000000000;
  local_118[0] = "==";
  local_118[1] = (char *)0x2;
  local_108 = (double)local_d8._40_8_;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1a6514;
  local_128 = (pointer)0x207;
  macroName_79.m_size = 5;
  macroName_79.m_start = "CHECK";
  capturedExpression_79.m_size = 0x1d;
  capturedExpression_79.m_start = "4. == continuous.decayChain()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_79,(SourceLineInfo *)local_130,
             capturedExpression_79,ContinueOnFailure);
  local_128._1_1_ = (double)local_d8._40_8_ == 4.0;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e8178;
  local_120 = (ITransientExpression *)0x4010000000000000;
  local_118[0] = "==";
  local_118[1] = (char *)0x2;
  local_108 = (double)local_d8._40_8_;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1a6514;
  local_128 = (pointer)0x208;
  macroName_80.m_size = 5;
  macroName_80.m_start = "CHECK";
  capturedExpression_80.m_size = 0x14;
  capturedExpression_80.m_start = "3 == continuous.NP()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_80,(SourceLineInfo *)local_130,
             capturedExpression_80,ContinueOnFailure);
  local_118[1] = (char *)((long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_finish -
                          (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start >> 3);
  local_128._1_1_ =
       (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start == 0x18;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e8278;
  local_128._4_4_ = 3;
  local_120 = (ITransientExpression *)0x1a8aca;
  local_118[0] = (char *)0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1a6514;
  local_128 = (pointer)0x209;
  macroName_81.m_size = 5;
  macroName_81.m_start = "CHECK";
  capturedExpression_81.m_size = 0x1e;
  capturedExpression_81.m_start = "3 == continuous.numberPoints()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_81,(SourceLineInfo *)local_130,
             capturedExpression_81,ContinueOnFailure);
  local_118[1] = (char *)((long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_finish -
                          (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start >> 3);
  local_128._1_1_ =
       (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start == 0x18;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e8278;
  local_128._4_4_ = 3;
  local_120 = (ITransientExpression *)0x1a8aca;
  local_118[0] = (char *)0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1a6514;
  local_128 = (pointer)0x20a;
  macroName_82.m_size = 5;
  macroName_82.m_start = "CHECK";
  capturedExpression_82.m_size = 0x14;
  capturedExpression_82.m_start = "1 == continuous.NR()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_82,(SourceLineInfo *)local_130,
             capturedExpression_82,ContinueOnFailure);
  lVar3 = CONCAT44(local_a8._12_4_,local_a8._8_4_) - local_a8._0_8_;
  local_118[1] = (char *)(lVar3 >> 3);
  local_128._1_1_ = lVar3 == 8;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e8278;
  local_128._4_4_ = 1;
  local_120 = (ITransientExpression *)0x1a8aca;
  local_118[0] = (char *)0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1a6514;
  local_128 = (pointer)0x20b;
  macroName_83.m_size = 5;
  macroName_83.m_start = "CHECK";
  capturedExpression_83.m_size = 0x2c;
  capturedExpression_83.m_start = "1 == continuous.numberInterpolationRegions()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_83,(SourceLineInfo *)local_130,
             capturedExpression_83,ContinueOnFailure);
  lVar3 = CONCAT44(local_a8._12_4_,local_a8._8_4_) - local_a8._0_8_;
  local_118[1] = (char *)(lVar3 >> 3);
  local_128._1_1_ = lVar3 == 8;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e8278;
  local_128._4_4_ = 1;
  local_120 = (ITransientExpression *)0x1a8aca;
  local_118[0] = (char *)0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1a6514;
  local_128 = (pointer)0x20c;
  macroName_84.m_size = 5;
  macroName_84.m_start = "CHECK";
  capturedExpression_84.m_size = 0x1c;
  capturedExpression_84.m_start = "1 == continuous.INT().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_84,(SourceLineInfo *)local_130,
             capturedExpression_84,ContinueOnFailure);
  local_118[1] = (char *)((long)local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_start >> 3);
  local_128._1_1_ =
       (long)local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start == 8;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e82b8;
  local_128._4_4_ = 1;
  local_120 = (ITransientExpression *)0x1a8aca;
  local_118[0] = (char *)0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1a6514;
  local_128 = (pointer)0x20d;
  macroName_85.m_size = 5;
  macroName_85.m_start = "CHECK";
  capturedExpression_85.m_size = 0x1c;
  capturedExpression_85.m_start = "1 == continuous.NBT().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_85,(SourceLineInfo *)local_130,
             capturedExpression_85,ContinueOnFailure);
  lVar3 = CONCAT44(local_a8._12_4_,local_a8._8_4_) - local_a8._0_8_;
  local_118[1] = (char *)(lVar3 >> 3);
  local_128._1_1_ = lVar3 == 8;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e82b8;
  local_128._4_4_ = 1;
  local_120 = (ITransientExpression *)0x1a8aca;
  local_118[0] = (char *)0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1a6514;
  local_128 = (pointer)0x20e;
  macroName_86.m_size = 5;
  macroName_86.m_start = "CHECK";
  capturedExpression_86.m_size = 0x18;
  capturedExpression_86.m_start = "1 == continuous.INT()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_86,(SourceLineInfo *)local_130,
             capturedExpression_86,ContinueOnFailure);
  local_118[1] = (char *)*local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start;
  local_128._1_1_ = local_118[1] == (char *)0x1;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e8278;
  local_128._4_4_ = 1;
  local_120 = (ITransientExpression *)0x1a8aca;
  local_118[0] = (char *)0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1a6514;
  local_128 = (pointer)0x20f;
  macroName_87.m_size = 5;
  macroName_87.m_start = "CHECK";
  capturedExpression_87.m_size = 0x18;
  capturedExpression_87.m_start = "3 == continuous.NBT()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_87,(SourceLineInfo *)local_130,
             capturedExpression_87,ContinueOnFailure);
  local_118[1] = *(char **)local_a8._0_8_;
  local_128._1_1_ = local_118[1] == (char *)0x3;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e8278;
  local_128._4_4_ = 3;
  local_120 = (ITransientExpression *)0x1a8aca;
  local_118[0] = (char *)0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1a6514;
  local_128 = (pointer)0x210;
  macroName_88.m_size = 5;
  macroName_88.m_start = "CHECK";
  capturedExpression_88.m_size = 0x25;
  capturedExpression_88.m_start = "1 == continuous.interpolants().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_88,(SourceLineInfo *)local_130,
             capturedExpression_88,ContinueOnFailure);
  local_118[1] = (char *)((long)local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_start >> 3);
  local_128._1_1_ =
       (long)local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start == 8;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e82b8;
  local_128._4_4_ = 1;
  local_120 = (ITransientExpression *)0x1a8aca;
  local_118[0] = (char *)0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1a6514;
  local_128 = (pointer)0x211;
  macroName_89.m_size = 5;
  macroName_89.m_start = "CHECK";
  capturedExpression_89.m_size = 0x23;
  capturedExpression_89.m_start = "1 == continuous.boundaries().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_89,(SourceLineInfo *)local_130,
             capturedExpression_89,ContinueOnFailure);
  lVar3 = CONCAT44(local_a8._12_4_,local_a8._8_4_) - local_a8._0_8_;
  local_118[1] = (char *)(lVar3 >> 3);
  local_128._1_1_ = lVar3 == 8;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e82b8;
  local_128._4_4_ = 1;
  local_120 = (ITransientExpression *)0x1a8aca;
  local_118[0] = (char *)0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1a6514;
  local_128 = (pointer)0x212;
  macroName_90.m_size = 5;
  macroName_90.m_start = "CHECK";
  capturedExpression_90.m_size = 0x21;
  capturedExpression_90.m_start = "1 == continuous.interpolants()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_90,(SourceLineInfo *)local_130,
             capturedExpression_90,ContinueOnFailure);
  local_118[1] = (char *)*local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start;
  local_128._1_1_ = local_118[1] == (char *)0x1;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e8278;
  local_128._4_4_ = 1;
  local_120 = (ITransientExpression *)0x1a8aca;
  local_118[0] = (char *)0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1a6514;
  local_128 = (pointer)0x213;
  macroName_91.m_size = 5;
  macroName_91.m_start = "CHECK";
  capturedExpression_91.m_size = 0x1f;
  capturedExpression_91.m_start = "3 == continuous.boundaries()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_91,(SourceLineInfo *)local_130,
             capturedExpression_91,ContinueOnFailure);
  local_118[1] = *(char **)local_a8._0_8_;
  local_128._1_1_ = local_118[1] == (char *)0x3;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e8278;
  local_128._4_4_ = 3;
  local_120 = (ITransientExpression *)0x1a8aca;
  local_118[0] = (char *)0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1a6514;
  local_128 = (pointer)0x214;
  macroName_92.m_size = 5;
  macroName_92.m_start = "CHECK";
  capturedExpression_92.m_size = 0x21;
  capturedExpression_92.m_start = "3 == continuous.energies().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_92,(SourceLineInfo *)local_130,
             capturedExpression_92,ContinueOnFailure);
  local_118[1] = (char *)((long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_finish -
                          (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start >> 3);
  local_128._1_1_ =
       (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start == 0x18;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e82b8;
  local_128._4_4_ = 3;
  local_120 = (ITransientExpression *)0x1a8aca;
  local_118[0] = (char *)0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1a6514;
  local_128 = (pointer)0x215;
  macroName_93.m_size = 5;
  macroName_93.m_start = "CHECK";
  capturedExpression_93.m_size = 0x27;
  capturedExpression_93.m_start = "3 == continuous.spectralValues().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_93,(SourceLineInfo *)local_130,
             capturedExpression_93,ContinueOnFailure);
  local_118[1] = (char *)((long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_finish -
                          (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start >> 3);
  local_128._1_1_ =
       (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start == 0x18;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e82b8;
  local_128._4_4_ = 3;
  local_120 = (ITransientExpression *)0x1a8aca;
  local_118[0] = (char *)0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1a6514;
  local_128 = (pointer)0x216;
  macroName_94.m_size = 10;
  macroName_94.m_start = "CHECK_THAT";
  capturedExpression_94.m_size = 0x2a;
  capturedExpression_94.m_start = "0.0, WithinRel( continuous.energies()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_94,(SourceLineInfo *)local_130,
             capturedExpression_94,ContinueOnFailure);
  local_40 = 0.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_130,
             *local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start);
  local_f8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_130,&local_40);
  local_f8.m_isBinaryExpression = true;
  local_f8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001e81f8;
  local_e8 = &local_40;
  local_e0 = (WithinRelMatcher *)local_130;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_178,&local_f8);
  Catch::ITransientExpression::~ITransientExpression(&local_f8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1a6514;
  local_128 = (pointer)0x217;
  macroName_95.m_size = 10;
  macroName_95.m_start = "CHECK_THAT";
  capturedExpression_95.m_size = 0x2b;
  capturedExpression_95.m_start = "5e+5, WithinRel( continuous.energies()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_95,(SourceLineInfo *)local_130,
             capturedExpression_95,ContinueOnFailure);
  local_40 = 500000.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_130,
             local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[1]);
  local_f8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_130,&local_40);
  local_f8.m_isBinaryExpression = true;
  local_f8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001e81f8;
  local_e8 = &local_40;
  local_e0 = (WithinRelMatcher *)local_130;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_178,&local_f8);
  Catch::ITransientExpression::~ITransientExpression(&local_f8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1a6514;
  local_128 = (pointer)0x218;
  macroName_96.m_size = 10;
  macroName_96.m_start = "CHECK_THAT";
  capturedExpression_96.m_size = 0x2d;
  capturedExpression_96.m_start = "7.3e+6, WithinRel( continuous.energies()[2] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_96,(SourceLineInfo *)local_130,
             capturedExpression_96,ContinueOnFailure);
  local_40 = 7300000.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_130,
             local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[2]);
  local_f8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_130,&local_40);
  local_f8.m_isBinaryExpression = true;
  local_f8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001e81f8;
  local_e8 = &local_40;
  local_e0 = (WithinRelMatcher *)local_130;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_178,&local_f8);
  Catch::ITransientExpression::~ITransientExpression(&local_f8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1a6514;
  local_128 = (pointer)0x219;
  macroName_97.m_size = 10;
  macroName_97.m_start = "CHECK_THAT";
  capturedExpression_97.m_size = 0x38;
  capturedExpression_97.m_start = "6.133200e-7, WithinRel( continuous.spectralValues()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_97,(SourceLineInfo *)local_130,
             capturedExpression_97,ContinueOnFailure);
  local_40 = 6.1332e-07;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_130,
             *local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start);
  local_f8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_130,&local_40);
  local_f8.m_isBinaryExpression = true;
  local_f8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001e81f8;
  local_e8 = &local_40;
  local_e0 = (WithinRelMatcher *)local_130;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_178,&local_f8);
  Catch::ITransientExpression::~ITransientExpression(&local_f8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1a6514;
  local_128 = (pointer)0x21a;
  macroName_98.m_size = 10;
  macroName_98.m_start = "CHECK_THAT";
  capturedExpression_98.m_size = 0x38;
  capturedExpression_98.m_start = "6.133300e-7, WithinRel( continuous.spectralValues()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_98,(SourceLineInfo *)local_130,
             capturedExpression_98,ContinueOnFailure);
  local_40 = 6.1333e-07;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_130,
             local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[1]);
  local_f8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_130,&local_40);
  local_f8.m_isBinaryExpression = true;
  local_f8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001e81f8;
  local_e8 = &local_40;
  local_e0 = (WithinRelMatcher *)local_130;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_178,&local_f8);
  Catch::ITransientExpression::~ITransientExpression(&local_f8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1a6514;
  local_128 = (pointer)0x21b;
  macroName_99.m_size = 10;
  macroName_99.m_start = "CHECK_THAT";
  capturedExpression_99.m_size = 0x38;
  capturedExpression_99.m_start = "6.02040e-17, WithinRel( continuous.spectralValues()[2] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_99,(SourceLineInfo *)local_130,
             capturedExpression_99,ContinueOnFailure);
  local_40 = 6.0204e-17;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_130,
             local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[2]);
  local_f8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_130,&local_40);
  local_f8.m_isBinaryExpression = true;
  local_f8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001e81f8;
  local_e8 = &local_40;
  local_e0 = (WithinRelMatcher *)local_130;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)local_178,&local_f8);
  Catch::ITransientExpression::~ITransientExpression(&local_f8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  local_130 = (undefined1  [8])0x1a6514;
  local_128 = (pointer)0x21d;
  macroName_x00100.m_size = 5;
  macroName_x00100.m_start = "CHECK";
  capturedExpression_x00100.m_size = 0x10;
  capturedExpression_x00100.m_start = "11 == chunk.NC()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_178,macroName_x00100,(SourceLineInfo *)local_130,
             capturedExpression_x00100,ContinueOnFailure);
  local_118[1] = (char *)njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum::NC(chunk);
  local_128._1_1_ = local_118[1] == (char *)0xb;
  local_128._0_1_ = true;
  local_130 = (undefined1  [8])&PTR_streamReconstructedExpression_001e8278;
  local_128._4_4_ = 0xb;
  local_120 = (ITransientExpression *)0x1a8aca;
  local_118[0] = (char *)0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_178,(ITransientExpression *)local_130);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_130);
  Catch::AssertionHandler::complete((AssertionHandler *)local_178);
  if (local_13d == false) {
    (*local_138->_vptr_IResultCapture[0x13])();
  }
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (long *)0x0) {
    operator_delete(local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((long *)local_a8._0_8_ != (long *)0x0) {
    operator_delete((void *)local_a8._0_8_,(long)local_98 - local_a8._0_8_);
  }
  return;
}

Assistant:

void verifyChunkWithLCONTwo( const DecaySpectrum& chunk ) {

  CHECK( 0. == chunk.STYP() );
  CHECK( 0. == chunk.radiationType() );

  CHECK( 2 == chunk.LCON() );
  CHECK( 2 == chunk.spectralTypeFlag() );
  CHECK( 0 == chunk.LCOV() );
  CHECK( 0 == chunk.covarianceFlag() );
  CHECK( 2 == chunk.NER() );
  CHECK( 2 == chunk.numberDiscreteSpectra() );

  CHECK_THAT( 1., WithinRel( chunk.FD()[0] ) );
  CHECK_THAT( 0., WithinRel( chunk.FD()[1] ) );
  CHECK_THAT( 1., WithinRel( chunk.discreteNormalisationFactor()[0] ) );
  CHECK_THAT( 0., WithinRel( chunk.discreteNormalisationFactor()[1] ) );
  CHECK_THAT( 0.5, WithinRel( chunk.FC()[0] ) );
  CHECK_THAT( 0.25, WithinRel( chunk.FC()[1] ) );
  CHECK_THAT( 0.5, WithinRel( chunk.continuousNormalisationFactor()[0] ) );
  CHECK_THAT( 0.25, WithinRel( chunk.continuousNormalisationFactor()[1] ) );
  CHECK_THAT( 2.107044e+2, WithinRel( chunk.ERAV()[0] ) );
  CHECK_THAT( 1.576284e+1, WithinRel( chunk.ERAV()[1] ) );
  CHECK_THAT( 2.107044e+2, WithinRel( chunk.averageDecayEnergy()[0] ) );
  CHECK_THAT( 1.576284e+1, WithinRel( chunk.averageDecayEnergy()[1] ) );

  CHECK( std::nullopt != chunk.continuousSpectrum() );

  auto discrete = chunk.discreteSpectra();
  CHECK( 3. == discrete[0].RTYP() );
  CHECK( 3. == discrete[0].decayChain() );
  CHECK( 12 == discrete[0].NT() );
  CHECK_THAT( 4.863000e+4, WithinRel( discrete[0].ER()[0] ) );
  CHECK_THAT( 5.000000e+1, WithinRel( discrete[0].ER()[1] ) );
  CHECK_THAT( 4.863000e+4, WithinRel( discrete[0].discreteEnergy()[0] ) );
  CHECK_THAT( 5.000000e+1, WithinRel( discrete[0].discreteEnergy()[1] ) );
  CHECK_THAT( 1.420112e-6, WithinRel( discrete[0].RI()[0] ) );
  CHECK_THAT( 2.85306e-10, WithinRel( discrete[0].RI()[1] ) );
  CHECK_THAT( 1.420112e-6, WithinRel( discrete[0].relativeIntensity()[0] ) );
  CHECK_THAT( 2.85306e-10, WithinRel( discrete[0].relativeIntensity()[1] ) );
  CHECK( 0. == discrete[0].TYPE() );
  CHECK( 0. == discrete[0].type() );
  CHECK_THAT( 0.0, WithinRel( discrete[0].RIS()[0] ) );
  CHECK_THAT( 0.0, WithinRel( discrete[0].RIS()[1] ) );
  CHECK_THAT( 0.0, WithinRel( discrete[0].internalPairFormationCoefficient()[0] ) );
  CHECK_THAT( 0.0, WithinRel( discrete[0].internalPairFormationCoefficient()[1] ) );
  CHECK_THAT( 7.010000e+5, WithinRel( discrete[0].RICC()[0] ) );
  CHECK_THAT( 1.106180e-2, WithinRel( discrete[0].RICC()[1] ) );
  CHECK_THAT( 7.010000e+5, WithinRel( discrete[0].totalInternalConversionCoefficient()[0] ) );
  CHECK_THAT( 1.106180e-2, WithinRel( discrete[0].totalInternalConversionCoefficient()[1] ) );
  CHECK_THAT( 0.0, WithinRel( discrete[0].RICK()[0] ) );
  CHECK_THAT( 0.0, WithinRel( discrete[0].RICK()[1] ) );
  CHECK_THAT( 0.0, WithinRel( discrete[0].internalConversionCoefficientKShell()[0] ) );
  CHECK_THAT( 0.0, WithinRel( discrete[0].internalConversionCoefficientKShell()[1] ) );
  CHECK_THAT( 3.315735e+5, WithinRel( discrete[0].RICL()[0] ) );
  CHECK_THAT( 5.608008e+3, WithinRel( discrete[0].RICL()[1] ) );
  CHECK_THAT( 3.315735e+5, WithinRel( discrete[0].internalConversionCoefficientLShell()[0] ) );
  CHECK_THAT( 5.608008e+3, WithinRel( discrete[0].internalConversionCoefficientLShell()[1] ) );
  CHECK( 4. == discrete[1].RTYP() );
  CHECK( 4. == discrete[1].decayChain() );
  CHECK( 12 == discrete[1].NT() );
  CHECK_THAT( 4.935000e+4, WithinRel( discrete[1].ER()[0] ) );
  CHECK_THAT( 2.000000e+1, WithinRel( discrete[1].ER()[1] ) );
  CHECK_THAT( 4.935000e+4, WithinRel( discrete[1].discreteEnergy()[0] ) );
  CHECK_THAT( 2.000000e+1, WithinRel( discrete[1].discreteEnergy()[1] ) );
  CHECK_THAT( 1.335690e-3, WithinRel( discrete[1].RI()[0] ) );
  CHECK_THAT( 5.409179e-5, WithinRel( discrete[1].RI()[1] ) );
  CHECK_THAT( 1.335690e-3, WithinRel( discrete[1].relativeIntensity()[0] ) );
  CHECK_THAT( 5.409179e-5, WithinRel( discrete[1].relativeIntensity()[1] ) );
  CHECK( 0. == discrete[1].TYPE() );
  CHECK( 0. == discrete[1].type() );
  CHECK_THAT( 0.0, WithinRel( discrete[1].RIS()[0] ) );
  CHECK_THAT( 0.0, WithinRel( discrete[1].RIS()[1] ) );
  CHECK_THAT( 0.0, WithinRel( discrete[1].internalPairFormationCoefficient()[0] ) );
  CHECK_THAT( 0.0, WithinRel( discrete[1].internalPairFormationCoefficient()[1] ) );
  CHECK_THAT( 8.209999e-1, WithinRel( discrete[1].RICC()[0] ) );
  CHECK_THAT( 0.000000e+0, WithinRel( discrete[1].RICC()[1] ) );
  CHECK_THAT( 8.209999e-1, WithinRel( discrete[1].totalInternalConversionCoefficient()[0] ) );
  CHECK_THAT( 0.000000e+0, WithinRel( discrete[1].totalInternalConversionCoefficient()[1] ) );
  CHECK_THAT( 0.0, WithinRel( discrete[1].RICK()[0] ) );
  CHECK_THAT( 0.0, WithinRel( discrete[1].RICK()[1] ) );
  CHECK_THAT( 0.0, WithinRel( discrete[1].internalConversionCoefficientKShell()[0] ) );
  CHECK_THAT( 0.0, WithinRel( discrete[1].internalConversionCoefficientKShell()[1] ) );
  CHECK_THAT( 6.160000e-1, WithinRel( discrete[1].RICL()[0] ) );
  CHECK_THAT( 8.999999e-3, WithinRel( discrete[1].RICL()[1] ) );
  CHECK_THAT( 6.160000e-1, WithinRel( discrete[1].internalConversionCoefficientLShell()[0] ) );
  CHECK_THAT( 8.999999e-3, WithinRel( discrete[1].internalConversionCoefficientLShell()[1] ) );

  ContinuousSpectrum continuous = *( chunk.continuousSpectrum() );
  CHECK( 4. == continuous.RTYP() );
  CHECK( 4. == continuous.decayChain() );
  CHECK( 3 == continuous.NP() );
  CHECK( 3 == continuous.numberPoints() );
  CHECK( 1 == continuous.NR() );
  CHECK( 1 == continuous.numberInterpolationRegions() );
  CHECK( 1 == continuous.INT().size() );
  CHECK( 1 == continuous.NBT().size() );
  CHECK( 1 == continuous.INT()[0] );
  CHECK( 3 == continuous.NBT()[0] );
  CHECK( 1 == continuous.interpolants().size() );
  CHECK( 1 == continuous.boundaries().size() );
  CHECK( 1 == continuous.interpolants()[0] );
  CHECK( 3 == continuous.boundaries()[0] );
  CHECK( 3 == continuous.energies().size() );
  CHECK( 3 == continuous.spectralValues().size() );
  CHECK_THAT( 0.0, WithinRel( continuous.energies()[0] ) );
  CHECK_THAT( 5e+5, WithinRel( continuous.energies()[1] ) );
  CHECK_THAT( 7.3e+6, WithinRel( continuous.energies()[2] ) );
  CHECK_THAT( 6.133200e-7, WithinRel( continuous.spectralValues()[0] ) );
  CHECK_THAT( 6.133300e-7, WithinRel( continuous.spectralValues()[1] ) );
  CHECK_THAT( 6.02040e-17, WithinRel( continuous.spectralValues()[2] ) );

  CHECK( 11 == chunk.NC() );
}